

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplaceRealloc<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,pointer pos,SourceLocation *args)

{
  pointer pSVar1;
  ulong uVar2;
  SourceLocation *__cur_1;
  SourceLocation *pSVar3;
  SourceLocation *pSVar4;
  SourceLocation *pSVar5;
  SourceLocation SVar6;
  SourceLocation ctx;
  long lVar7;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  SVar6 = (SourceLocation)(this->len + 1);
  uVar2 = this->cap;
  ctx = (SourceLocation)(uVar2 * 2);
  if ((ulong)SVar6 < (ulong)ctx) {
    SVar6 = ctx;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    SVar6 = (SourceLocation)0xfffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pSVar3 = (SourceLocation *)operator_new((long)SVar6 * 8);
  *(SourceLocation *)((long)pSVar3 + lVar7) = *args;
  pSVar5 = this->data_;
  pSVar1 = pSVar5 + this->len;
  pSVar4 = pSVar3;
  if (pSVar1 == pos) {
    for (; pSVar5 != pos; pSVar5 = pSVar5 + 1) {
      *pSVar4 = *pSVar5;
      pSVar4 = pSVar4 + 1;
    }
  }
  else {
    for (; pSVar5 != pos; pSVar5 = pSVar5 + 1) {
      ctx = *pSVar5;
      *pSVar4 = ctx;
      pSVar4 = pSVar4 + 1;
    }
    pSVar5 = (SourceLocation *)(lVar7 + (long)pSVar3);
    for (; pSVar5 = pSVar5 + 1, pos != pSVar1; pos = pos + 1) {
      *pSVar5 = *pos;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)SVar6;
  this->data_ = pSVar3;
  return (pointer)((long)pSVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}